

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# at.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  ThreadedSocketAcceptor *this;
  SocketAcceptor *this_00;
  string file;
  SessionSettings settings;
  Application application;
  FileStoreFactory factory;
  string local_238;
  undefined1 *local_218;
  undefined8 local_210;
  undefined1 local_208;
  undefined7 uStack_207;
  SessionSettings local_1f8;
  Application local_168;
  undefined **local_160;
  undefined **local_158;
  undefined **local_150;
  undefined **local_148;
  undefined **local_140;
  undefined **local_138;
  undefined **local_130;
  undefined **local_128;
  undefined **local_120;
  undefined4 local_110 [2];
  undefined8 local_108;
  undefined4 *local_100;
  undefined4 *local_f8;
  undefined8 local_f0;
  FileStoreFactory local_e8 [184];
  
  local_210 = 0;
  local_208 = 0;
  local_218 = &local_208;
  iVar1 = getopt(argc,argv,"+f:");
  if (iVar1 != 0x66) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x158128);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," -f FILE [-t]",0xd);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    if (local_218 != &local_208) {
      operator_delete(local_218,CONCAT71(uStack_207,local_208) + 1);
    }
    return 1;
  }
  std::__cxx11::string::operator=((string *)&local_218,optarg);
  iVar1 = getopt(argc,argv,"+t");
  FIX::SessionSettings::SessionSettings(&local_1f8,(string *)&local_218,false);
  local_100 = local_110;
  local_168._vptr_Application = (_func_int **)&PTR__Application_0014eb58;
  local_160 = &PTR__MessageCracker_0014ebd8;
  local_158 = &PTR__MessageCracker_0014ee20;
  local_150 = &PTR__MessageCracker_0014f010;
  local_148 = &PTR__MessageCracker_0014f320;
  local_140 = &PTR__MessageCracker_0014f790;
  local_138 = &PTR__MessageCracker_0014fd90;
  local_130 = &PTR__MessageCracker_00150390;
  local_128 = &PTR__MessageCracker_00150a50;
  local_120 = &PTR__MessageCracker_00151440;
  local_110[0] = 0;
  local_108 = 0;
  local_f0 = 0;
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  local_f8 = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"store","");
  FIX::FileStoreFactory::FileStoreFactory(local_e8,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if (iVar1 == 0x74) {
    this = (ThreadedSocketAcceptor *)operator_new(0x228);
    FIX::ThreadedSocketAcceptor::ThreadedSocketAcceptor
              (this,&local_168,(MessageStoreFactory *)local_e8,&local_1f8);
  }
  else {
    this_00 = (SocketAcceptor *)operator_new(0x1d0);
    FIX::SocketAcceptor::SocketAcceptor
              (this_00,&local_168,(MessageStoreFactory *)local_e8,&local_1f8);
  }
  FIX::Acceptor::start();
  do {
    FIX::process_sleep(1.0);
  } while( true );
}

Assistant:

int main(int argc, char **argv) {
  std::string file;
  bool threaded = false;

  if (getopt(argc, argv, "+f:") == 'f') {
    file = optarg;
  } else {
    std::cout << "usage: " << argv[0] << " -f FILE [-t]" << std::endl;
    return 1;
  }

  if (getopt(argc, argv, "+t") == 't') {
    threaded = true;
  }

  try {
    FIX::SessionSettings settings(file);
    Application application;
    FIX::FileStoreFactory factory("store");

    AcceptorPtr pAcceptor;
    if (threaded) {
      pAcceptor.reset(new FIX::ThreadedSocketAcceptor(application, factory, settings));
    } else {
      pAcceptor.reset(new FIX::SocketAcceptor(application, factory, settings));
    }

    pAcceptor->start();
    while (true) {
      FIX::process_sleep(1);
    }
    pAcceptor->stop();
  } catch (std::exception &e) {
    std::cout << e.what();
    return 2;
  }

  return 0;
}